

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

Symbol * __thiscall
slang::ast::anon_unknown_39::getVirtualInterfaceTarget
          (anon_unknown_39 *this,Type *type,ASTContext *context,SourceRange range)

{
  Symbol *pSVar1;
  long lVar2;
  SourceRange sourceRange;
  
  sourceRange.endLoc = range.startLoc;
  if (((ulong)(type->super_Symbol).name._M_str & 0x20) != 0) {
    sourceRange.startLoc = (SourceLocation)context;
    ASTContext::addDiag((ASTContext *)type,(DiagCode)0x4c0007,sourceRange);
  }
  lVar2 = *(long *)(this + 0x40);
  if (lVar2 == 0) {
    Type::resolveCanonical((Type *)this);
    lVar2 = *(long *)(this + 0x40);
  }
  pSVar1 = *(Symbol **)(lVar2 + 0x50);
  if (pSVar1 == (Symbol *)0x0) {
    pSVar1 = *(Symbol **)(lVar2 + 0x48);
  }
  return pSVar1;
}

Assistant:

const Symbol* getVirtualInterfaceTarget(const Type& type, const ASTContext& context,
                                        SourceRange range) {
    if (context.flags.has(ASTFlags::NonProcedural))
        context.addDiag(diag::DynamicNotProcedural, range);

    auto& vit = type.getCanonicalType().as<VirtualInterfaceType>();
    if (vit.modport)
        return vit.modport;

    return &vit.iface;
}